

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O1

bool bsim::operator>(quad_value_bit_vector *a,quad_value_bit_vector *b)

{
  byte bVar1;
  pointer pqVar2;
  vector<bsim::quad_value,_std::allocator<bsim::quad_value>_> *pvVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar4 = (ulong)a->N;
  bVar9 = (long)uVar4 < 1;
  if (0 < (long)uVar4) {
    pqVar2 = (a->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (1 < pqVar2->value) {
      return false;
    }
    uVar5 = 1;
    do {
      uVar7 = uVar5;
      if (uVar4 == uVar7) break;
      uVar5 = uVar7 + 1;
    } while (pqVar2[uVar7].value < 2);
    bVar9 = uVar4 <= uVar7;
  }
  if (bVar9) {
    uVar5 = (ulong)b->N;
    bVar9 = (long)uVar5 < 1;
    if (0 < (long)uVar5) {
      pqVar2 = (b->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (1 < pqVar2->value) {
        return false;
      }
      uVar7 = 1;
      do {
        uVar8 = uVar7;
        if (uVar5 == uVar8) break;
        uVar7 = uVar8 + 1;
      } while (pqVar2[uVar8].value < 2);
      bVar9 = uVar5 <= uVar8;
    }
    if (bVar9) {
      pvVar3 = &a->bits;
      do {
        uVar5 = uVar4;
        bVar6 = (byte)a;
        if ((long)uVar5 < 1) goto LAB_0013e0c5;
        bVar6 = (pvVar3->super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>).
                _M_impl.super__Vector_impl_data._M_start[uVar5 - 1].value;
        a = (quad_value_bit_vector *)(ulong)bVar6;
        if (bVar6 == 3) {
          __assert_fail("!a.is_high_impedance()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                        ,0xde,"bool bsim::operator>(const quad_value &, const quad_value &)");
        }
        bVar1 = (b->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar5 - 1].value;
        if (bVar1 == 3) {
          __assert_fail("!b.is_high_impedance()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                        ,0xdf,"bool bsim::operator>(const quad_value &, const quad_value &)");
        }
        if (1 < bVar6) {
          __assert_fail("a.is_binary()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                        ,0xe1,"bool bsim::operator>(const quad_value &, const quad_value &)");
        }
        if (1 < bVar1) {
          __assert_fail("b.is_binary()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                        ,0xe2,"bool bsim::operator>(const quad_value &, const quad_value &)");
        }
        if (bVar1 < bVar6) {
          bVar6 = 1;
          goto LAB_0013e0c5;
        }
        uVar4 = uVar5 - 1;
      } while (bVar1 <= bVar6);
      bVar6 = 0;
LAB_0013e0c5:
      return (bool)(0 < (long)uVar5 & bVar6);
    }
  }
  return false;
}

Assistant:

static inline bool operator>(const quad_value_bit_vector& a,
  			       const quad_value_bit_vector& b) {
    if (!a.is_binary() || !b.is_binary()) {
      return false;
    }

    int N = a.bitLength();
    for (int i = N - 1; i >= 0; i--) {
      if (a.get(i) > b.get(i)) {
  	return true;
      }

      if (a.get(i) < b.get(i)) {
  	return false;
      }
    }

    return false;
  }